

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.h
# Opt level: O3

optional<pbrt::LightLiSample> * __thiscall
pbrt::PointLight::SampleLi
          (optional<pbrt::LightLiSample> *__return_storage_ptr__,PointLight *this,
          LightSampleContext ctx,Point2f u,SampledWavelengths lambda,LightSamplingMode mode)

{
  undefined8 uVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  ulong uVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [56];
  undefined1 auVar11 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [56];
  undefined1 auVar15 [64];
  float fVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  SampledSpectrum SVar25;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  
  auVar9 = ZEXT816(0) << 0x40;
  auVar19 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 1)
                          ,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][1]),0x10);
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[2][1] * 0.0)),
                           auVar9,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][0]));
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)((this->super_LightBase).renderFromLight.m.m[3][1] * 0.0))
                            ,auVar9,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][0])
                           );
  auVar8 = vfmadd231ss_fma(auVar8,auVar9,
                           ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[2][2]));
  auVar18 = vfmadd231ss_fma(auVar18,auVar9,
                            ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[3][2]));
  fVar17 = auVar18._0_4_ + (this->super_LightBase).renderFromLight.m.m[3][3];
  fVar3 = auVar8._0_4_ + (this->super_LightBase).renderFromLight.m.m[2][3];
  bVar2 = fVar17 == 1.0;
  auVar8 = vinsertps_avx(ctx.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>._0_16_,
                         ZEXT416((uint)ctx.pi.super_Point3<pbrt::Interval>.
                                       super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),0x10);
  auVar16 = ZEXT856(auVar8._8_8_);
  uVar5 = 0xff;
  if (!bVar2) {
    uVar5 = 0;
  }
  uVar6 = (ulong)uVar5;
  if (NAN(fVar17)) {
    uVar6 = 0;
  }
  fVar7 = (float)((uint)bVar2 * (int)fVar3 + (uint)!bVar2 * (int)(fVar3 / fVar17));
  auVar18 = vinsertps_avx((undefined1  [16])(this->super_LightBase).renderFromLight.m.m[0],
                          ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][0]),0x10);
  auVar9 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 2),
                         ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][2]),0x10);
  fVar4 = fVar7 + (ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
                   low + ctx.pi.super_Point3<pbrt::Interval>.
                         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * -0.5;
  fVar3 = this->scale;
  auVar14 = vinsertps_avx(*(undefined1 (*) [16])((this->super_LightBase).renderFromLight.m.m[0] + 3)
                          ,ZEXT416((uint)(this->super_LightBase).renderFromLight.m.m[1][3]),0x10);
  auVar12 = ZEXT856(auVar14._8_8_);
  SVar25 = DenselySampledSpectrum::Sample(&this->I,&lambda);
  auVar15._0_8_ = SVar25.values.values._8_8_;
  auVar15._8_56_ = auVar16;
  auVar11._0_8_ = SVar25.values.values._0_8_;
  auVar11._8_56_ = auVar12;
  local_78 = auVar19._0_4_;
  fStack_74 = auVar19._4_4_;
  fStack_70 = auVar19._8_4_;
  fStack_6c = auVar19._12_4_;
  auVar20._0_4_ = local_78 * 0.0;
  auVar20._4_4_ = fStack_74 * 0.0;
  auVar20._8_4_ = fStack_70 * 0.0;
  auVar20._12_4_ = fStack_6c * 0.0;
  auVar19 = vmovlhps_avx(auVar11._0_16_,auVar15._0_16_);
  auVar10._0_4_ = auVar19._0_4_ * fVar3;
  auVar10._4_4_ = auVar19._4_4_ * fVar3;
  auVar10._8_4_ = auVar19._8_4_ * fVar3;
  auVar10._12_4_ = auVar19._12_4_ * fVar3;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
  local_98 = auVar8._0_4_;
  fStack_94 = auVar8._4_4_;
  fStack_90 = auVar8._8_4_;
  fStack_8c = auVar8._12_4_;
  auVar13._0_4_ =
       ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high +
       local_98;
  auVar13._4_4_ =
       ctx.pi.super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low +
       fStack_94;
  auVar13._8_4_ = fStack_90 + 0.0;
  auVar13._12_4_ = fStack_8c + 0.0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  __return_storage_ptr__->set = true;
  auVar19 = vfmadd231ps_fma(auVar20,ZEXT816(0) << 0x40,auVar18);
  auVar8._8_4_ = 0xbf000000;
  auVar8._0_8_ = 0xbf000000bf000000;
  auVar8._12_4_ = 0xbf000000;
  auVar8 = vmulps_avx512vl(auVar13,auVar8);
  auVar19 = vfmadd231ps_fma(auVar19,ZEXT816(0) << 0x40,auVar9);
  local_68 = auVar14._0_4_;
  fStack_64 = auVar14._4_4_;
  fStack_60 = auVar14._8_4_;
  fStack_5c = auVar14._12_4_;
  auVar18._0_4_ = auVar19._0_4_ + local_68;
  auVar18._4_4_ = auVar19._4_4_ + fStack_64;
  auVar18._8_4_ = auVar19._8_4_ + fStack_60;
  auVar18._12_4_ = auVar19._12_4_ + fStack_5c;
  auVar21._4_4_ = fVar17;
  auVar21._0_4_ = fVar17;
  auVar21._8_4_ = fVar17;
  auVar21._12_4_ = fVar17;
  auVar19 = vdivps_avx(auVar18,auVar21);
  bVar2 = (bool)((byte)uVar6 & 1);
  auVar9._0_4_ = (float)((uint)bVar2 * (int)auVar18._0_4_ | (uint)!bVar2 * auVar19._0_4_);
  bVar2 = (bool)((byte)(uVar6 >> 1) & 1);
  auVar9._4_4_ = (float)((uint)bVar2 * (int)auVar18._4_4_ | (uint)!bVar2 * auVar19._4_4_);
  bVar2 = (bool)((byte)(uVar6 >> 2) & 1);
  auVar9._8_4_ = (float)((uint)bVar2 * (int)auVar18._8_4_ | (uint)!bVar2 * auVar19._8_4_);
  bVar2 = (bool)((byte)(uVar6 >> 3) & 1);
  auVar9._12_4_ = (float)((uint)bVar2 * (int)auVar18._12_4_ | (uint)!bVar2 * auVar19._12_4_);
  auVar14._0_4_ = auVar9._0_4_ + auVar8._0_4_;
  auVar14._4_4_ = auVar9._4_4_ + auVar8._4_4_;
  auVar14._8_4_ = auVar9._8_4_ + auVar8._8_4_;
  auVar14._12_4_ = auVar9._12_4_ + auVar8._12_4_;
  auVar19._0_4_ = auVar14._0_4_ * auVar14._0_4_;
  auVar19._4_4_ = auVar14._4_4_ * auVar14._4_4_;
  auVar19._8_4_ = auVar14._8_4_ * auVar14._8_4_;
  auVar19._12_4_ = auVar14._12_4_ * auVar14._12_4_;
  auVar19 = vhaddps_avx(auVar19,auVar19);
  fVar17 = auVar19._0_4_ + fVar4 * fVar4;
  auVar22._4_4_ = fVar17;
  auVar22._0_4_ = fVar17;
  auVar22._8_4_ = fVar17;
  auVar22._12_4_ = fVar17;
  auVar19 = vdivps_avx(auVar10,auVar22);
  auVar18 = vsqrtss_avx(ZEXT416((uint)fVar17),ZEXT416((uint)fVar17));
  *(undefined1 (*) [16])&__return_storage_ptr__->optionalValue = auVar19;
  auVar8 = vshufps_avx(auVar9,auVar9,0x50);
  fVar17 = auVar18._0_4_;
  auVar23._4_4_ = fVar17;
  auVar23._0_4_ = fVar17;
  auVar23._8_4_ = fVar17;
  auVar23._12_4_ = fVar17;
  auVar19 = vdivps_avx(auVar14,auVar23);
  auVar24._4_4_ = fVar7;
  auVar24._0_4_ = fVar7;
  auVar24._8_4_ = fVar7;
  auVar24._12_4_ = fVar7;
  uVar1 = vmovlps_avx(auVar19);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = uVar1;
  *(float *)((long)&__return_storage_ptr__->optionalValue + 0x18) = fVar4 / fVar17;
  *(undefined4 *)((long)&__return_storage_ptr__->optionalValue + 0x1c) = 0x3f800000;
  *(undefined1 (*) [16])((long)&__return_storage_ptr__->optionalValue + 0x20) = auVar8;
  uVar1 = vmovlps_avx(auVar24);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = uVar1;
  *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x60) =
       &(this->super_LightBase).mediumInterface;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<LightLiSample> SampleLi(LightSampleContext ctx, Point2f u,
                                           SampledWavelengths lambda,
                                           LightSamplingMode mode) const {
        Point3f p = renderFromLight(Point3f(0, 0, 0));
        Vector3f wi = Normalize(p - ctx.p());
        SampledSpectrum Li = scale * I.Sample(lambda) / DistanceSquared(p, ctx.p());
        return LightLiSample(Li, wi, 1, Interaction(p, &mediumInterface));
    }